

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  byte *in_RSI;
  long in_RDI;
  int num_input;
  int in_stack_000002ac;
  int in_stack_000002b0;
  int in_stack_000002b4;
  Mat *in_stack_000002b8;
  Mat *in_stack_000002c0;
  
  if ((*(int *)(in_RDI + 0x140) == 0) &&
     (convolution1d_transform_kernel_packed
                (in_stack_000002c0,in_stack_000002b8,in_stack_000002b4,in_stack_000002b0,
                 in_stack_000002ac), (*in_RSI & 1) != 0)) {
    puVar3 = (undefined8 *)(in_RDI + 0x148);
    if (*(long *)(in_RDI + 0x150) != 0) {
      piVar2 = *(int **)(in_RDI + 0x150);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(in_RDI + 0x168) == 0) {
          if ((void *)*puVar3 != (void *)0x0) {
            free((void *)*puVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x168) + 0x18))(*(long **)(in_RDI + 0x168),*puVar3);
        }
      }
    }
    *puVar3 = 0;
    *(undefined8 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x170) = 0;
    *(undefined4 *)(in_RDI + 0x174) = 0;
    *(undefined4 *)(in_RDI + 0x178) = 0;
    *(undefined4 *)(in_RDI + 0x17c) = 0;
    *(undefined4 *)(in_RDI + 0x180) = 0;
    *(undefined8 *)(in_RDI + 0x188) = 0;
    *(undefined8 *)(in_RDI + 0x150) = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}